

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::HDivDirections
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this,TPZVec<double> *pt,
          TPZFMatrix<double> *directions)

{
  double local_3a8;
  TPZFNMatrix<9,_double> gradx;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  
  TPZFNMatrix<9,_double>::TPZFNMatrix(&jac,3,3);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&jacinv,3,3);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&axes,3,3);
  local_3a8 = 0.0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradx,3,3,&local_3a8);
  (**(code **)(*(long *)&this->super_TPZGeoEl + 0x230))(this,pt,&gradx);
  pztopology::TPZPrism::ComputeHDivDirections<double>(&gradx.super_TPZFMatrix<double>,directions);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradx);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&axes);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&jacinv);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&jac);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirections(TPZVec<REAL> &pt, TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> jac(TGeo::Dimension,TGeo::Dimension), jacinv(TGeo::Dimension,TGeo::Dimension), axes(TGeo::Dimension,3), gradx(3,TGeo::Dimension,0.);
  
    this->GradX(pt, gradx);

    TGeo::ComputeHDivDirections(gradx, directions);
    
}